

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::CompilationUnitSymbol::CompilationUnitSymbol
          (CompilationUnitSymbol *this,Compilation *compilation)

{
  PackageSymbol *pkg;
  WildcardImportSymbol *this_00;
  
  (this->super_Symbol).kind = CompilationUnit;
  (this->super_Symbol).name._M_len = 0;
  (this->super_Symbol).name._M_str = "";
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).location = (SourceLocation)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->super_Symbol).parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->super_Symbol).nextInScope + 4) = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  (this->timeScale).base.unit = Seconds;
  (this->timeScale).base.magnitude = One;
  (this->timeScale).precision.unit = Seconds;
  (this->timeScale).precision.magnitude = One;
  this->anyMembers = false;
  (this->unitsRange).super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  (this->precisionRange).super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  this->timeScale = compilation->defaultTimeScale;
  pkg = compilation->stdPkg;
  this_00 = BumpAllocator::
            emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                      (&compilation->super_BumpAllocator,&(pkg->super_Symbol).name,
                       (SourceLocation *)&SourceLocation::NoLocation);
  WildcardImportSymbol::setPackage(this_00,pkg);
  Scope::addWildcardImport(&this->super_Scope,this_00);
  return;
}

Assistant:

CompilationUnitSymbol::CompilationUnitSymbol(Compilation& compilation) :
    Symbol(SymbolKind::CompilationUnit, "", SourceLocation()), Scope(compilation, this) {

    // Default the time scale to the compilation default. If it turns out
    // this scope has a time unit declaration it will overwrite the member.
    timeScale = compilation.getDefaultTimeScale();

    // All compilation units import the std package automatically.
    auto& stdPkg = compilation.getStdPackage();
    auto import = compilation.emplace<WildcardImportSymbol>(stdPkg.name,
                                                            SourceLocation::NoLocation);
    import->setPackage(stdPkg);
    addWildcardImport(*import);
}